

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O3

void tchecker::dbm::reset_to_sum(db_t *dbm,clock_id_t dim,clock_id_t x,clock_id_t y,integer_t value)

{
  bool bVar1;
  db_t dVar2;
  clock_id_t cVar3;
  clock_id_t z;
  ulong uVar4;
  db_t local_50;
  db_t local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x18d,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (dim == 0) {
    __assert_fail("dim >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x18e,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  bVar1 = is_consistent(dbm,dim);
  if (!bVar1) {
    __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,399,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  bVar1 = is_tight(dbm,dim);
  if (!bVar1) {
    __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,400,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (dim <= x) {
    __assert_fail("x < dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x191,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (dim <= y) {
    __assert_fail("y < dim",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x192,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  if (value < 0) {
    __assert_fail("0 <= value",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x193,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  local_38 = (ulong)(y * dim);
  local_40 = (ulong)(x * dim);
  uVar4 = 0;
  cVar3 = x;
  local_48 = (ulong)dim;
  do {
    local_50 = (db_t)(value * 2 + 1);
    dVar2 = sum(dbm + (uint)((int)local_38 + (int)uVar4),&local_50);
    dbm[(uint)((int)local_40 + (int)uVar4)] = dVar2;
    local_4c = (db_t)(value * -2 + 1);
    dVar2 = sum(dbm + y,&local_4c);
    dbm[cVar3] = dVar2;
    uVar4 = uVar4 + 1;
    cVar3 = cVar3 + dim;
    y = y + dim;
  } while (local_48 != uVar4);
  dbm[(dim + 1) * x] = (db_t)0x1;
  bVar1 = is_consistent(dbm,(clock_id_t)local_48);
  if (bVar1) {
    bVar1 = is_tight(dbm,dim);
    if (bVar1) {
      return;
    }
    __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x1a9,
                  "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
                 );
  }
  __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x1a8,
                "void tchecker::dbm::reset_to_sum(tchecker::dbm::db_t *, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::clock_id_t, tchecker::integer_t)"
               );
}

Assistant:

void reset_to_sum(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, tchecker::clock_id_t x, tchecker::clock_id_t y,
                  tchecker::integer_t value)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
  assert(x < dim);
  assert(y < dim);
  assert(0 <= value);

  // NB: this is a reset not a constraint. Hence, resetting x:=y+value
  // only impacts difference bounds involving x (i.e. x-z and z-x
  // for all z including y and 0). Other difference bounds u-v for
  // any u,v distinct from x are not touched since the values of u
  // and v are not modified when x is reset to y+value

  // If x == y:
  // x' - x <= v & x - z <= d & z = z' --> x' - z' <= d+v
  // x - x' <= -v & z - x <= d & z = z' --> z' - x' <= d-v

  // If x != y:
  // x - y <= v & y - z <= d --> x - z <= d+v
  // y - x <= -v & z - y <= d --> z - x <= d-v
  for (tchecker::clock_id_t z = 0; z < dim; ++z) {
    DBM(x, z) = tchecker::dbm::add(DBM(y, z), value);
    DBM(z, x) = tchecker::dbm::add(DBM(z, y), -value);
  }
  DBM(x, x) = tchecker::dbm::LE_ZERO; // cheaper than testing in loop

  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}